

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

void print_list_aux(List *ls,int indent,FILE *out)

{
  char *__s;
  ListStruct *local_130;
  List *l2;
  char buf [256];
  int i;
  BOOL print_space;
  FILE *out_local;
  ListStruct *pLStack_10;
  int indent_local;
  List *ls_local;
  
  buf[0xfc] = '\0';
  buf[0xfd] = '\0';
  buf[0xfe] = '\0';
  buf[0xff] = '\0';
  for (pLStack_10 = ls; pLStack_10 != (List *)0x0; pLStack_10 = pLStack_10->cdr) {
    if (buf._252_4_ == 0) {
      buf[0xfc] = '\x01';
      buf[0xfd] = '\0';
      buf[0xfe] = '\0';
      buf[0xff] = '\0';
    }
    else {
      putc(0x20,(FILE *)out);
    }
    if ((pLStack_10->token).type == TOK_LIST) {
      for (local_130 = pLStack_10->car;
          (local_130 != (ListStruct *)0x0 && ((local_130->token).type != TOK_LIST));
          local_130 = local_130->cdr) {
      }
      if (local_130 == (ListStruct *)0x0) {
        putc(0x28,(FILE *)out);
        print_list_aux(pLStack_10->car,indent,out);
        putc(0x29,(FILE *)out);
      }
      else {
        putc(10,(FILE *)out);
        buf[0xf8] = '\0';
        buf[0xf9] = '\0';
        buf[0xfa] = '\0';
        buf[0xfb] = '\0';
        for (; (int)buf._248_4_ < indent; buf._248_4_ = buf._248_4_ + 1) {
          putc(0x20,(FILE *)out);
        }
        putc(0x28,(FILE *)out);
        print_list_aux(pLStack_10->car,indent + 2,out);
        putc(0x29,(FILE *)out);
      }
    }
    else {
      __s = unparse_token(&pLStack_10->token,(char *)&l2);
      fputs(__s,(FILE *)out);
    }
  }
  return;
}

Assistant:

static void
print_list_aux (const List *ls, int indent, FILE *out)
{
  BOOL print_space = FALSE;
  int i;
  char buf[256];
  const List *l2;

  for (; ls != NULL; ls = ls->cdr)
    {
      /* Print a space before each token but the first. */
      if (print_space) putc (' ', out);
      else print_space = TRUE;

      /* Print lists recursively. */
      if (ls->token.type == TOK_LIST)
	{
	  /* If it has sublists, or it's a sequence, put it down on another
           * line and indent it.
	   */
	  for (l2 = ls->car; l2 != NULL; l2 = l2->cdr)
	    if (l2->token.type == TOK_LIST)
	      break;
	  if (l2 != NULL)
	    {
	      putc ('\n', out);
	      for (i = 0; i < indent; i++)
		putc (' ', out);
	      putc ('(', out);
	      print_list_aux (ls->car, indent + 2, out);
	      putc (')', out);
	    }
	  else    /* No sublists? */
	    {
	      putc ('(', out);
	      print_list_aux (ls->car, indent, out);
	      putc (')', out);
	    }
	}
      else fputs (unparse_token (&ls->token, buf), out);
    }
}